

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::Expression::bindLookupResult
          (Expression *this,Compilation *compilation,LookupResult *result,SourceRange sourceRange,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  ExpressionKind EVar1;
  ExpressionSyntax *pEVar2;
  SourceLocation SVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  SourceRange range;
  SourceRange range_00;
  bool bVar10;
  Type *pTVar11;
  AssertionInstanceExpression *pAVar12;
  SourceLocation SVar13;
  AssertionInstanceExpression *pAVar14;
  InvalidExpression *pIVar15;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *ppEVar16;
  Diagnostic *pDVar17;
  Compilation *compilation_00;
  SourceLocation SVar18;
  InvocationExpressionSyntax *pIVar19;
  long lVar20;
  MemberSelector *selector;
  AssertionInstanceExpression *pAVar21;
  ulong offset;
  byte bVar22;
  SourceRange range_01;
  SourceRange sourceRange_00;
  SourceRange SVar23;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors_00;
  SourceRange sourceRange_01;
  SourceRange range_02;
  SourceRange sourceRange_02;
  span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
  selectors;
  LookupResult nextResult;
  undefined1 in_stack_fffffffffffffd78;
  SourceLocation in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  SourceRange local_270;
  InvocationExpressionSyntax *local_260;
  SourceLocation local_258;
  Compilation *local_250;
  Compilation *local_248;
  undefined1 local_240 [32];
  SourceLocation SStack_220;
  undefined1 local_218 [32];
  size_type local_1f8;
  size_type local_1f0;
  sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> local_1e8 [8];
  SmallVectorBase<slang::Diagnostic> local_128;
  
  SVar13 = sourceRange.endLoc;
  local_270.endLoc = sourceRange.startLoc;
  pAVar12 = (AssertionInstanceExpression *)(compilation->super_BumpAllocator).head;
  local_270.startLoc = (SourceLocation)result;
  if (pAVar12 == (AssertionInstanceExpression *)0x0) {
    local_218._0_8_ = (AssertionInstanceExpression *)0x0;
  }
  else {
    SVar18 = SVar13;
    pIVar19 = invocation;
    if ((((ulong)(withClause->method).ptr & 4) == 0) ||
       (bVar10 = Symbol::isType((Symbol *)pAVar12), !bVar10)) {
      if (((((SVar13 != (SourceLocation)0x0) &&
            ((pAVar12->super_Expression).kind == (Dist|LValueReference))) &&
           (lVar20._0_4_ = (compilation->options).maxConstexprBacktrace,
           lVar20._4_4_ = (compilation->options).maxDefParamSteps, lVar20 == 0)) &&
          ((SVar3 = (pAVar12->super_Expression).sourceRange.startLoc, SVar3 != (SourceLocation)0x0
           && (pAVar14 = *(AssertionInstanceExpression **)((long)SVar3 + 8),
              (pAVar14->super_Expression).kind == (Dist|EmptyArgument))))) &&
         ((*(AssertionInstanceExpression **)&pAVar14[1].isRecursiveProperty == pAVar12 &&
          (pAVar12 = pAVar14, *(int *)((long)&pAVar14[1].arguments.size_ + 4) != 0)))) {
        assert::assertFailed
                  ("scope->asSymbol().as<SubroutineSymbol>().subroutineKind == SubroutineKind::Function"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                   ,0x3ba,
                   "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                  );
      }
      EVar1 = (pAVar12->super_Expression).kind;
      local_260 = invocation;
      local_258 = SVar13;
      local_250 = (Compilation *)this;
      if ((int)EVar1 < 0x4d) {
        if (EVar1 == (Dist|EmptyArgument)) {
          lVar8._0_4_ = (compilation->options).maxConstexprBacktrace;
          lVar8._4_4_ = (compilation->options).maxDefParamSteps;
          if (lVar8 != 0) {
            assert::assertFailed
                      ("result.selectors.empty()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Expression.cpp"
                       ,0x3c2,
                       "static Expression &slang::ast::Expression::bindLookupResult(Compilation &, LookupResult &, SourceRange, const InvocationExpressionSyntax *, const ArrayOrRandomizeMethodExpressionSyntax *, const ASTContext &)"
                      );
          }
          if (SVar13 == (SourceLocation)0x0) {
            SStack_220 = local_270.endLoc;
            local_240._24_8_ = local_270.startLoc;
          }
          else {
            join_0x00000010_0x00000000_ =
                 slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar13);
          }
          if ((pAVar12->super_Expression).kind != (Dist|EmptyArgument)) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                       ,0xc4,
                       "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::SubroutineSymbol]")
            ;
          }
          local_1e8[0].distance_from_desired = '\0';
          local_258 = (SourceLocation)0x0;
          in_stack_fffffffffffffd80 = SStack_220;
          local_218._0_8_ = pAVar12;
          pAVar14 = (AssertionInstanceExpression *)
                    CallExpression::fromLookup
                              ((CallExpression *)this,(Compilation *)local_218,(Subroutine *)0x0,
                               (Expression *)SVar13,invocation,withClause,unique0x100002ed,
                               (ASTContext *)
                               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
          local_260 = (InvocationExpressionSyntax *)0x0;
        }
        else {
          if (EVar1 == 0x46) {
            lVar5._0_4_ = (compilation->options).maxConstexprBacktrace;
            lVar5._4_4_ = (compilation->options).maxDefParamSteps;
            SVar13._1_7_ = 0;
            SVar13._0_1_ = lVar5 != 0;
            bVar22 = *(byte *)((long)&(compilation->options).maxInstanceDepth + 1);
          }
          else {
LAB_0024f72b:
            bVar22 = *(byte *)((long)&(compilation->options).maxInstanceDepth + 1);
            SVar13 = (SourceLocation)0x0;
          }
          sourceRange_01.endLoc = SVar13;
          sourceRange_01.startLoc = local_270.endLoc;
          pAVar14 = (AssertionInstanceExpression *)
                    ValueExpressionBase::fromSymbol
                              ((ValueExpressionBase *)withClause,(ASTContext *)pAVar12,
                               (Symbol *)(ulong)bVar22,local_270.startLoc._0_1_,sourceRange_01,
                               (bool)in_stack_fffffffffffffd78);
        }
      }
      else {
        if (1 < EVar1 - 0x4d) {
          if (EVar1 == 0x4f) {
            range_01.endLoc = (SourceLocation)withClause;
            range_01.startLoc = local_270.endLoc;
            pAVar14 = (AssertionInstanceExpression *)
                      AssertionInstanceExpression::bindPort
                                (pAVar12,(Symbol *)local_270.startLoc,range_01,(ASTContext *)SVar18)
            ;
            goto LAB_0024f84f;
          }
          if (EVar1 != 0x53) goto LAB_0024f72b;
        }
        lVar4._0_4_ = (compilation->options).maxConstexprBacktrace;
        lVar4._4_4_ = (compilation->options).maxDefParamSteps;
        SVar18 = (SourceLocation)0x0;
        if (lVar4 == 0) {
          SVar18 = SVar13;
          local_258 = (SourceLocation)0x0;
        }
        range_02.endLoc = (SourceLocation)withClause;
        range_02.startLoc = local_270.endLoc;
        pAVar14 = (AssertionInstanceExpression *)
                  AssertionInstanceExpression::fromLookup
                            (pAVar12,(Symbol *)SVar18,
                             (InvocationExpressionSyntax *)local_270.startLoc,range_02,
                             (ASTContext *)pIVar19);
        if (((pAVar12->super_Expression).kind == 0x53) &&
           (*(char *)((long)&(compilation->options).maxInstanceDepth + 1) == '\x01')) {
          if (SVar18 == (SourceLocation)0x0) {
            sourceRange_00.endLoc = local_270.endLoc;
            sourceRange_00.startLoc = local_270.startLoc;
          }
          else {
            sourceRange_00 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar18);
          }
          ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x5b0007,sourceRange_00);
        }
      }
LAB_0024f84f:
      lVar6._0_4_ = (compilation->options).maxConstexprBacktrace;
      lVar6._4_4_ = (compilation->options).maxDefParamSteps;
      bVar22 = lVar6 != 0;
      pAVar21 = pAVar14;
      if (((bool)bVar22) && (bVar10 = bad(&pAVar14->super_Expression), !bVar10)) {
        lVar20 = 0;
        offset = 0;
        local_248 = compilation;
        do {
          uVar7._0_4_ = (compilation->options).maxConstexprBacktrace;
          uVar7._4_4_ = (compilation->options).maxDefParamSteps;
          if (uVar7 <= offset) {
            assert::assertFailed
                      ("index < len",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                       ,0x196,
                       "reference slang::SmallVectorBase<std::variant<const slang::syntax::ElementSelectSyntax *, slang::ast::LookupResult::MemberSelector>>::operator[](size_type) [T = std::variant<const slang::syntax::ElementSelectSyntax *, slang::ast::LookupResult::MemberSelector>]"
                      );
          }
          lVar8 = *(long *)&(compilation->options).maxConstexprDepth;
          if (lVar8 == 0) {
            selector = (MemberSelector *)0x0;
          }
          else {
            selector = (MemberSelector *)0x0;
            if (*(char *)(lVar8 + 0x28 + lVar20) == '\x01') {
              selector = (MemberSelector *)(lVar8 + lVar20);
            }
          }
          if (selector == (MemberSelector *)0x0) {
            ppEVar16 = std::
                       get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                                 ((variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   *)(lVar8 + lVar20));
            pAVar14 = (AssertionInstanceExpression *)
                      bindSelector(local_250,&pAVar14->super_Expression,*ppEVar16,
                                   (ASTContext *)withClause);
LAB_0024fa8f:
            bVar10 = true;
          }
          else {
            pTVar11 = (pAVar14->super_Expression).type.ptr;
            if (pTVar11 == (Type *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                        );
            }
            if (pTVar11->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar11);
            }
            compilation = local_248;
            SVar13 = local_258;
            pIVar19 = local_260;
            if ((pTVar11->canonical->super_Symbol).kind != VirtualInterfaceType) {
              if (offset == *(long *)&(local_248->options).maxConstexprBacktrace - 1U) {
                pAVar14 = (AssertionInstanceExpression *)
                          MemberAccessExpression::fromSelector
                                    (local_250,&pAVar14->super_Expression,selector,
                                     (InvocationExpressionSyntax *)local_258,
                                     (ArrayOrRandomizeMethodExpressionSyntax *)local_260,
                                     (ASTContext *)withClause);
                compilation = local_248;
                local_260 = pIVar19;
                local_258 = SVar13;
                if ((pAVar14->super_Expression).kind == Call) {
                  local_258 = (SourceLocation)0x0;
                  local_260 = (InvocationExpressionSyntax *)0x0;
                }
              }
              else {
                pAVar14 = (AssertionInstanceExpression *)
                          MemberAccessExpression::fromSelector
                                    (local_250,&pAVar14->super_Expression,selector,
                                     (InvocationExpressionSyntax *)0x0,
                                     (ArrayOrRandomizeMethodExpressionSyntax *)0x0,
                                     (ASTContext *)withClause);
              }
              goto LAB_0024fa8f;
            }
            local_218._0_8_ = (AssertionInstanceExpression *)0x0;
            local_218._8_5_ = 0;
            local_218._13_3_ = Min >> 8;
            local_218._16_5_ = 0;
            local_218._24_8_ = local_1e8;
            local_1f8 = 0;
            local_1f0 = 4;
            local_128.data_ = (pointer)local_128.firstElement;
            local_128.len = 0;
            local_128.cap = 2;
            local_240._8_8_ = *(undefined8 *)&(local_248->options).maxConstexprDepth;
            local_240._16_4_ = (local_248->options).maxConstexprBacktrace;
            local_240._20_4_ = (local_248->options).maxDefParamSteps;
            pTVar11 = (pAVar14->super_Expression).type.ptr;
            if (pTVar11 == (Type *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                        );
            }
            SVar23 = (pAVar14->super_Expression).sourceRange;
            selectors_00 = nonstd::span_lite::
                           span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                           ::subspan((span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
                                      *)(local_240 + 8),offset,0xffffffffffffffff);
            Lookup::selectChild(pTVar11,SVar23,selectors_00,(ASTContext *)withClause,
                                (LookupResult *)local_218);
            LookupResult::reportDiags((LookupResult *)local_218,(ASTContext *)withClause);
            if ((AssertionInstanceExpression *)local_218._0_8_ == (AssertionInstanceExpression *)0x0
               ) {
              compilation_00 = (Compilation *)local_240;
              local_240._0_8_ = pAVar14;
              pAVar12 = (AssertionInstanceExpression *)
                        BumpAllocator::
                        emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                                  (&local_250->super_BumpAllocator,(Expression **)compilation_00,
                                   local_250->errorType);
            }
            else {
              compilation_00 = (Compilation *)local_218;
              sourceRange_02.endLoc = local_258;
              sourceRange_02.startLoc = local_270.endLoc;
              pAVar12 = (AssertionInstanceExpression *)
                        bindLookupResult((Expression *)local_250,compilation_00,
                                         (LookupResult *)local_270.startLoc,sourceRange_02,local_260
                                         ,withClause,(ASTContext *)in_stack_fffffffffffffd80);
            }
            SmallVectorBase<slang::Diagnostic>::cleanup(&local_128,(EVP_PKEY_CTX *)compilation_00);
            compilation = local_248;
            if ((sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                local_218._24_8_ != local_1e8) {
              free((void *)local_218._24_8_);
            }
            bVar10 = false;
          }
          pAVar21 = pAVar12;
          if (!bVar10) break;
          offset = offset + 1;
          uVar9._0_4_ = (compilation->options).maxConstexprBacktrace;
          uVar9._4_4_ = (compilation->options).maxDefParamSteps;
          bVar22 = offset < uVar9;
          if (!(bool)bVar22) break;
          bVar10 = bad(&pAVar14->super_Expression);
          lVar20 = lVar20 + 0x30;
          pAVar21 = pAVar14;
        } while (!bVar10);
      }
      if ((bVar22 & 1) != 0) {
        return &pAVar21->super_Expression;
      }
      bVar10 = bad(&pAVar14->super_Expression);
      if (bVar10) {
        return &pAVar14->super_Expression;
      }
      if (local_258 == (SourceLocation)0x0) {
        if (local_260 == (InvocationExpressionSyntax *)0x0) {
          return &pAVar14->super_Expression;
        }
        SVar23 = parsing::Token::range((Token *)&local_260->attributes);
        ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x920007,SVar23);
      }
      else {
        pEVar2 = (ExpressionSyntax *)((string_view *)((long)local_258 + 0x48))->_M_len;
        SVar13 = local_270.startLoc;
        if (pEVar2 != (ExpressionSyntax *)0x0) {
          SVar13 = parsing::Token::location((Token *)(pEVar2 + 1));
        }
        pDVar17 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x4d0007,SVar13);
        range.endLoc = local_270.endLoc;
        range.startLoc = local_270.startLoc;
        Diagnostic::operator<<(pDVar17,range);
      }
      SVar13 = (SourceLocation)local_250->errorType;
      this = (Expression *)local_250;
      local_218._0_8_ = pAVar14;
      goto LAB_0024f6e0;
    }
    SVar23.endLoc = (SourceLocation)withClause;
    SVar23.startLoc = local_270.endLoc;
    pTVar11 = Type::fromLookupResult
                        ((Type *)this,compilation,(LookupResult *)local_270.startLoc,SVar23,
                         (ASTContext *)pIVar19);
    pAVar12 = (AssertionInstanceExpression *)
              BumpAllocator::
              emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange&>
                        ((BumpAllocator *)this,pTVar11,&local_270);
    bVar10 = bad((Expression *)pAVar12);
    if (bVar10) {
      return &pAVar12->super_Expression;
    }
    local_218._0_8_ = pAVar12;
    if (SVar13 == (SourceLocation)0x0) {
      if (invocation == (InvocationExpressionSyntax *)0x0) {
        return &pAVar12->super_Expression;
      }
      SVar23 = parsing::Token::range((Token *)&invocation->attributes);
      ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x920007,SVar23);
    }
    else {
      pEVar2 = (ExpressionSyntax *)((string_view *)((long)SVar13 + 0x48))->_M_len;
      SVar13 = local_270.startLoc;
      if (pEVar2 != (ExpressionSyntax *)0x0) {
        SVar13 = parsing::Token::location((Token *)(pEVar2 + 1));
      }
      pDVar17 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x4d0007,SVar13);
      range_00.endLoc = local_270.endLoc;
      range_00.startLoc = local_270.startLoc;
      Diagnostic::operator<<(pDVar17,range_00);
    }
  }
  SVar13 = this[6].sourceRange.startLoc;
LAB_0024f6e0:
  pIVar15 = BumpAllocator::
            emplace<slang::ast::InvalidExpression,slang::ast::Expression_const*&,slang::ast::Type_const&>
                      ((BumpAllocator *)this,(Expression **)local_218,(Type *)SVar13);
  return &pIVar15->super_Expression;
}

Assistant:

Expression& Expression::bindLookupResult(Compilation& compilation, LookupResult& result,
                                         SourceRange sourceRange,
                                         const InvocationExpressionSyntax* invocation,
                                         const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                         const ASTContext& context) {
    const Symbol* symbol = result.found;
    if (!symbol)
        return badExpr(compilation, nullptr);

    auto errorIfInvoke = [&]() {
        // If we require a subroutine, enforce that now. The invocation syntax will have been
        // nulled out if we used it elsewhere in this function.
        if (invocation) {
            SourceLocation loc = invocation->arguments ? invocation->arguments->openParen.location()
                                                       : sourceRange.start();
            auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
            diag << sourceRange;
            return false;
        }
        else if (withClause) {
            context.addDiag(diag::UnexpectedWithClause, withClause->with.range());
            return false;
        }
        return true;
    };

    if (context.flags.has(ASTFlags::AllowDataType) && symbol->isType()) {
        // We looked up a named data type and we were allowed to do so, so return it.
        const Type& resultType = Type::fromLookupResult(compilation, result, sourceRange, context);
        auto expr = compilation.emplace<DataTypeExpression>(resultType, sourceRange);
        if (!expr->bad() && !errorIfInvoke())
            return badExpr(compilation, expr);

        return *expr;
    }

    // Recursive function call
    if (invocation && symbol->kind == SymbolKind::Variable && result.selectors.empty()) {
        // TODO: check nested scopes?
        auto scope = symbol->getParentScope();
        if (scope && scope->asSymbol().kind == SymbolKind::Subroutine &&
            scope->asSymbol().as<SubroutineSymbol>().returnValVar == symbol) {
            ASSERT(scope->asSymbol().as<SubroutineSymbol>().subroutineKind ==
                   SubroutineKind::Function);
            symbol = &scope->asSymbol();
        }
    }

    Expression* expr;
    switch (symbol->kind) {
        case SymbolKind::Subroutine: {
            ASSERT(result.selectors.empty());
            SourceRange callRange = invocation ? invocation->sourceRange() : sourceRange;
            expr = &CallExpression::fromLookup(compilation, &symbol->as<SubroutineSymbol>(),
                                               nullptr, invocation, withClause, callRange, context);
            invocation = nullptr;
            withClause = nullptr;
            break;
        }
        case SymbolKind::Sequence:
        case SymbolKind::Property:
        case SymbolKind::LetDecl: {
            const InvocationExpressionSyntax* localInvoke = nullptr;
            if (result.selectors.empty())
                localInvoke = std::exchange(invocation, nullptr);

            expr = &AssertionInstanceExpression::fromLookup(*symbol, localInvoke, sourceRange,
                                                            context);

            if (symbol->kind == SymbolKind::LetDecl && result.isHierarchical) {
                SourceRange callRange = localInvoke ? localInvoke->sourceRange() : sourceRange;
                context.addDiag(diag::LetHierarchical, callRange);
            }
            break;
        }
        case SymbolKind::AssertionPort:
            expr = &AssertionInstanceExpression::bindPort(*symbol, sourceRange, context);
            break;
        case SymbolKind::ConstraintBlock: {
            // If there are selectors then this is ok -- either they will be valid because
            // they're accessing a built-in method or they will issue an error.
            bool constraintAllowed = !result.selectors.empty();
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange, constraintAllowed);
            break;
        }
        default:
            expr = &ValueExpressionBase::fromSymbol(context, *symbol, result.isHierarchical,
                                                    sourceRange);
            break;
    }

    // Drill down into member accesses.
    for (size_t i = 0; i < result.selectors.size(); i++) {
        if (expr->bad())
            return *expr;

        auto& selector = result.selectors[i];
        auto memberSelect = std::get_if<LookupResult::MemberSelector>(&selector);
        if (memberSelect) {
            // If this is an access via a virtual interface we need to look at
            // all the selectors together, as this may constitute a hierarchical reference.
            if (expr->type->isVirtualInterface()) {
                LookupResult nextResult;
                span<LookupResult::Selector> selectors = result.selectors;
                Lookup::selectChild(*expr->type, expr->sourceRange, selectors.subspan(i), context,
                                    nextResult);

                nextResult.reportDiags(context);
                if (!nextResult.found)
                    return badExpr(compilation, expr);

                return bindLookupResult(compilation, nextResult, sourceRange, invocation,
                                        withClause, context);
            }

            if (i == result.selectors.size() - 1) {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             invocation, withClause, context);

                if (expr->kind == ExpressionKind::Call) {
                    invocation = nullptr;
                    withClause = nullptr;
                }
            }
            else {
                expr = &MemberAccessExpression::fromSelector(compilation, *expr, *memberSelect,
                                                             nullptr, nullptr, context);
            }
        }
        else {
            // Element / range selectors.
            auto selectSyntax = std::get<const ElementSelectSyntax*>(selector);
            expr = &bindSelector(compilation, *expr, *selectSyntax, context);
        }
    }

    if (!expr->bad() && !errorIfInvoke())
        return badExpr(compilation, expr);

    return *expr;
}